

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

insert_result * __thiscall
crnlib::
hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>
::insert(insert_result *__return_storage_ptr__,
        hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>
        *this,vec<6U,_float> *k,uint *v)

{
  bool bVar1;
  uint *v_local;
  vec<6U,_float> *k_local;
  hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>
  *this_local;
  insert_result *result;
  
  std::
  pair<crnlib::hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>::iterator,_bool>
  ::
  pair<crnlib::hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>::iterator,_bool,_true>
            (__return_storage_ptr__);
  bVar1 = insert_no_grow(this,__return_storage_ptr__,k,v);
  if (!bVar1) {
    grow(this);
    bVar1 = insert_no_grow(this,__return_storage_ptr__,k,v);
    if (!bVar1) {
      crnlib_fail("\"insert() failed\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_hash_map.h"
                  ,0x204);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline insert_result insert(const Key& k, const Value& v = Value())
        {
            insert_result result;
            if (!insert_no_grow(result, k, v))
            {
                grow();

                // This must succeed.
                if (!insert_no_grow(result, k, v))
                {
                    CRNLIB_FAIL("insert() failed");
                }
            }

            return result;
        }